

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_execSequenceLast7
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *base,
                 BYTE *vBase,BYTE *dictEnd)

{
  BYTE *__dest;
  BYTE *pBVar1;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *vBase_local;
  BYTE *base_local;
  BYTE *litLimit_local;
  BYTE **litPtr_local;
  BYTE *oend_local;
  BYTE *op_local;
  
  __dest = op + sequence.litLength;
  op_local = (BYTE *)(sequence.litLength + sequence.matchLength);
  length1 = (long)__dest - sequence.offset;
  if (oend < op + (long)op_local) {
    op_local = (BYTE *)0xffffffffffffffba;
  }
  else {
    oend_local = op;
    if (litLimit < *litPtr + sequence.litLength) {
      op_local = (BYTE *)0xffffffffffffffec;
    }
    else {
      while (oend_local < __dest) {
        pBVar1 = *litPtr;
        *litPtr = pBVar1 + 1;
        *oend_local = *pBVar1;
        oend_local = oend_local + 1;
      }
      if ((ulong)((long)__dest - (long)base) < sequence.offset) {
        if ((ulong)((long)__dest - (long)vBase) < sequence.offset) {
          return 0xffffffffffffffec;
        }
        pBVar1 = dictEnd + -((long)base - length1);
        if (pBVar1 + sequence.matchLength <= dictEnd) {
          memmove(__dest,pBVar1,sequence.matchLength);
          return (size_t)op_local;
        }
        memmove(__dest,pBVar1,(long)dictEnd - (long)pBVar1);
        oend_local = __dest + ((long)dictEnd - (long)pBVar1);
        length1 = (size_t)base;
      }
      while (oend_local < op + (long)op_local) {
        *oend_local = *(BYTE *)length1;
        length1 = length1 + 1;
        oend_local = oend_local + 1;
      }
    }
  }
  return (size_t)op_local;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceLast7(BYTE* op,
                              BYTE* const oend, seq_t sequence,
                              const BYTE** litPtr, const BYTE* const litLimit,
                              const BYTE* const base, const BYTE* const vBase, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    BYTE* const oMatchEnd = op + sequenceLength;   /* risk : address space overflow (32-bits) */
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;

    /* check */
    if (oMatchEnd>oend) return ERROR(dstSize_tooSmall);   /* last match must fit within dstBuffer */
    if (iLitEnd > litLimit) return ERROR(corruption_detected);   /* try to read beyond literal buffer */

    /* copy literals */
    while (op < oLitEnd) *op++ = *(*litPtr)++;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - base)) {
        /* offset beyond prefix */
        if (sequence.offset > (size_t)(oLitEnd - vBase)) return ERROR(corruption_detected);
        match = dictEnd - (base-match);
        if (match + sequence.matchLength <= dictEnd) {
            memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
            memmove(oLitEnd, match, length1);
            op = oLitEnd + length1;
            sequence.matchLength -= length1;
            match = base;
    }   }
    while (op < oMatchEnd) *op++ = *match++;
    return sequenceLength;
}